

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

error_code llvm::errorToErrorCode(Error *Err)

{
  ErrorInfoBase *pEVar1;
  long *plVar2;
  char cVar3;
  long *plVar4;
  _Alloc_hider _Var5;
  long *plVar6;
  error_code eVar7;
  Error local_90;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_88;
  anon_class_8_1_3fcf615c local_80;
  Error local_78;
  long *local_70;
  ulong local_68;
  error_code EC;
  string local_50;
  
  EC._M_value = 0;
  EC._M_cat = (error_category *)std::_V2::system_category();
  pEVar1 = Err->Payload;
  Err->Payload = (ErrorInfoBase *)0x0;
  plVar6 = (long *)((ulong)pEVar1 & 0xfffffffffffffffe);
  local_80.EC = &EC;
  if (plVar6 == (long *)0x0) {
    local_90.Payload = (ErrorInfoBase *)0x1;
  }
  else {
    cVar3 = (**(code **)(*plVar6 + 0x30))(plVar6);
    if (cVar3 == '\0') {
      local_50._M_dataplus._M_p = (pointer)plVar6;
      handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                ((llvm *)&local_90,
                 (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 &local_50,&local_80);
      _Var5._M_p = local_50._M_dataplus._M_p;
      if ((long *)local_50._M_dataplus._M_p == (long *)0x0) goto LAB_00118b5a;
    }
    else {
      plVar2 = (long *)plVar6[2];
      local_90.Payload = (ErrorInfoBase *)0x1;
      local_70 = plVar6;
      for (plVar4 = (long *)plVar6[1]; _Var5._M_p = (pointer)local_70, plVar4 != plVar2;
          plVar4 = plVar4 + 1) {
        local_78.Payload = (ErrorInfoBase *)((ulong)local_90.Payload | 1);
        local_88._M_head_impl = (ErrorInfoBase *)*plVar4;
        *plVar4 = 0;
        handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
                  ((llvm *)&local_68,
                   (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                   &local_88,&local_80);
        ErrorList::join((ErrorList *)&local_50,&local_78,(Error *)&local_68);
        _Var5._M_p = local_50._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)0x0;
        if ((long *)(local_68 & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)(local_68 & 0xfffffffffffffffe) + 8))();
        }
        if (local_88._M_head_impl != (ErrorInfoBase *)0x0) {
          (*(local_88._M_head_impl)->_vptr_ErrorInfoBase[1])();
        }
        local_88._M_head_impl = (ErrorInfoBase *)0x0;
        if ((long *)((ulong)local_78.Payload & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_78.Payload & 0xfffffffffffffffe) + 8))();
        }
        local_90.Payload = (ErrorInfoBase *)((ulong)_Var5._M_p | 1);
      }
    }
    (**(code **)(*(long *)_Var5._M_p + 8))();
  }
LAB_00118b5a:
  cantFail(&local_90,(char *)0x0);
  if ((long *)((ulong)local_90.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_90.Payload & 0xfffffffffffffffe) + 8))();
  }
  eVar7 = inconvertibleErrorCode();
  if (EC._M_value == eVar7._M_value && EC._M_cat == eVar7._M_cat) {
    (**(code **)(*(long *)EC._M_cat + 0x20))(&local_50,EC._M_cat,eVar7._M_value);
    report_fatal_error(&local_50,true);
  }
  eVar7._4_4_ = 0;
  eVar7._M_value = EC._M_value;
  eVar7._M_cat = EC._M_cat;
  return eVar7;
}

Assistant:

std::error_code errorToErrorCode(Error Err) {
  std::error_code EC;
  handleAllErrors(std::move(Err), [&](const ErrorInfoBase &EI) {
    EC = EI.convertToErrorCode();
  });
  if (EC == inconvertibleErrorCode())
    report_fatal_error(EC.message());
  return EC;
}